

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

wstring * __thiscall
mjs::(anonymous_namespace)::to_radix_string_inner_abi_cxx11_
          (wstring *__return_storage_ptr__,_anonymous_namespace_ *this,double x,int radix,
          bool int_part)

{
  uint __line;
  int __y;
  char *__assertion;
  int iVar1;
  double dVar2;
  allocator<wchar_t> local_71;
  double local_70;
  double local_68;
  wstring res;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_38;
  
  if (0xffffffffffffe < (long)x - 1U &&
      ((long)x < 0 || 0x3fe < (uint)((long)ABS(x) + 0xfff0000000000000U >> 0x35))) {
    __assertion = "std::isfinite(x) && x > 0";
    __line = 0x39;
LAB_00154d41:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,__line,
                  "std::wstring mjs::(anonymous namespace)::to_radix_string_inner(double, int, bool)"
                 );
  }
  __y = (int)this;
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = L'\0';
  local_68 = (double)__y;
  iVar1 = -0x44c;
  do {
    iVar1 = iVar1 + 1;
    if (iVar1 == 0) break;
    if ((char)radix == '\0') {
      if (1.0 < x) {
        __assertion = "x <= 1.0";
        __line = 0x47;
        goto LAB_00154d41;
      }
      local_70 = x * local_68;
      dVar2 = floor(local_70);
      dVar2 = std::fmod<double,int>(dVar2,__y);
      local_70 = local_70 - dVar2;
    }
    else {
      local_70 = x;
      dVar2 = floor(x);
      if (((local_70 <= 0.0) || (local_70 != dVar2)) || (NAN(local_70) || NAN(dVar2))) {
        __assertion = "x > 0.0 && x == std::floor(x)";
        __line = 0x43;
        goto LAB_00154d41;
      }
      dVar2 = std::fmod<double,int>(local_70,__y);
      local_70 = (local_70 - dVar2) / local_68;
    }
    if ((dVar2 < 0.0) || (local_68 <= dVar2)) {
      __assertion = "rem >= 0 && rem < radix";
      __line = 0x4d;
      goto LAB_00154d41;
    }
    std::__cxx11::wstring::push_back((wchar_t)&res);
    x = local_70;
  } while ((local_70 != 0.0) || (NAN(local_70)));
  if ((char)radix == '\0') {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)&res);
  }
  else {
    local_38.current._M_current =
         (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          )(res._M_dataplus._M_p + res._M_string_length);
    local_40.current._M_current =
         (__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          )(__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            )res._M_dataplus._M_p;
    std::__cxx11::wstring::
    wstring<std::reverse_iterator<__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>>,void>
              ((wstring *)__return_storage_ptr__,&local_38,&local_40,&local_71);
  }
  std::__cxx11::wstring::~wstring((wstring *)&res);
  return __return_storage_ptr__;
}

Assistant:

std::wstring to_radix_string_inner(double x, int radix, bool int_part) {
    assert(std::isfinite(x) && x > 0);
    constexpr const char digits[37] = "0123456789abcdefghijklmnopqrstuvwxyz";
    std::wstring res;
    int iter = 1100;
    do {
        if (!--iter) {
            break;
        }
        double rem, n;
        if (int_part) {
            assert(x > 0.0 && x == std::floor(x));
            rem = std::fmod(x, radix);
            n   = (x - rem) / radix;
        } else {
            assert(x <= 1.0);
            n = x*radix;
            rem = std::fmod(std::floor(n), radix);
            n -= rem;
        }

        assert(rem >= 0 && rem < radix);
        res += digits[static_cast<int>(rem)];
        x = n;

    } while (x != 0.0);

    return int_part ? std::wstring(res.crbegin(), res.crend()) : res;
}